

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::findBucket<SubArray>
          (Data<QHashPrivate::Node<SubArray,_Macro>_> *this,SubArray *key)

{
  size_t hash;
  Bucket BVar1;
  
  hash = qHash(key,this->seed);
  BVar1 = findBucketWithHash<SubArray>(this,key,hash);
  return BVar1;
}

Assistant:

Bucket findBucket(const K &key) const noexcept
    {
        size_t hash = QHashPrivate::calculateHash(key, seed);
        return findBucketWithHash(key, hash);
    }